

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

void MIR_output_str(MIR_context_t ctx,FILE *f,MIR_str_t str)

{
  ushort **ppuVar1;
  char *pcVar2;
  ulong local_30;
  size_t i;
  FILE *f_local;
  MIR_context_t ctx_local;
  MIR_str_t str_local;
  
  pcVar2 = str.s;
  fprintf((FILE *)f,"\"");
  for (local_30 = 0; local_30 < str.len; local_30 = local_30 + 1) {
    if (pcVar2[local_30] == '\\') {
      fprintf((FILE *)f,"\\\\");
    }
    else if (pcVar2[local_30] == '\"') {
      fprintf((FILE *)f,"\\\"");
    }
    else {
      ppuVar1 = __ctype_b_loc();
      if (((*ppuVar1)[(int)pcVar2[local_30]] & 0x4000) == 0) {
        if (pcVar2[local_30] == '\n') {
          fprintf((FILE *)f,"\\n");
        }
        else if (pcVar2[local_30] == '\t') {
          fprintf((FILE *)f,"\\t");
        }
        else if (pcVar2[local_30] == '\v') {
          fprintf((FILE *)f,"\\v");
        }
        else if (pcVar2[local_30] == '\a') {
          fprintf((FILE *)f,"\\a");
        }
        else if (pcVar2[local_30] == '\b') {
          fprintf((FILE *)f,"\\b");
        }
        else if (pcVar2[local_30] == '\f') {
          fprintf((FILE *)f,"\\f");
        }
        else {
          fprintf((FILE *)f,"\\%03o",(ulong)(byte)pcVar2[local_30]);
        }
      }
      else {
        fprintf((FILE *)f,"%c",(ulong)(uint)(int)pcVar2[local_30]);
      }
    }
  }
  fprintf((FILE *)f,"\"");
  return;
}

Assistant:

void MIR_output_str (MIR_context_t ctx MIR_UNUSED, FILE *f, MIR_str_t str) {
  fprintf (f, "\"");
  for (size_t i = 0; i < str.len; i++)
    if (str.s[i] == '\\')
      fprintf (f, "\\\\");
    else if (str.s[i] == '"')
      fprintf (f, "\\\"");
    else if (isprint (str.s[i]))
      fprintf (f, "%c", str.s[i]);
    else if (str.s[i] == '\n')
      fprintf (f, "\\n");
    else if (str.s[i] == '\t')
      fprintf (f, "\\t");
    else if (str.s[i] == '\v')
      fprintf (f, "\\v");
    else if (str.s[i] == '\a')
      fprintf (f, "\\a");
    else if (str.s[i] == '\b')
      fprintf (f, "\\b");
    else if (str.s[i] == '\f')
      fprintf (f, "\\f");
    else
      fprintf (f, "\\%03o", (unsigned char) str.s[i]);
  fprintf (f, "\"");
}